

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask.c
# Opt level: O2

void aom_highbd_blend_a64_vmask_c
               (uint8_t *dst_8,uint32_t dst_stride,uint8_t *src0_8,uint32_t src0_stride,
               uint8_t *src1_8,uint32_t src1_stride,uint8_t *mask,int w,int h,int bd)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  uVar4 = 0;
  uVar2 = (ulong)(uint)w;
  if (w < 1) {
    uVar2 = uVar4;
  }
  uVar3 = (ulong)(uint)h;
  if (h < 1) {
    uVar3 = uVar4;
  }
  uVar7 = 0;
  uVar6 = 0;
  for (uVar9 = 0; uVar9 != uVar3; uVar9 = uVar9 + 1) {
    bVar1 = mask[uVar9];
    iVar8 = (int)uVar4;
    uVar5 = uVar2;
    uVar10 = uVar7;
    uVar11 = uVar6;
    while( true ) {
      bVar12 = uVar5 == 0;
      uVar5 = uVar5 - 1;
      if (bVar12) break;
      *(short *)((long)dst_8 * 2 + (ulong)uVar11 * 2) =
           (short)((uint)*(ushort *)((long)src0_8 * 2 + uVar4 * 2) * (uint)bVar1 +
                   (uint)*(ushort *)((long)src1_8 * 2 + (ulong)uVar10 * 2) * (0x40 - (uint)bVar1) +
                   0x20 >> 6);
      uVar11 = uVar11 + 1;
      uVar10 = uVar10 + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    uVar6 = uVar6 + dst_stride;
    uVar7 = uVar7 + src1_stride;
    uVar4 = (ulong)(iVar8 + src0_stride);
  }
  return;
}

Assistant:

void aom_highbd_blend_a64_vmask_c(uint8_t *dst_8, uint32_t dst_stride,
                                  const uint8_t *src0_8, uint32_t src0_stride,
                                  const uint8_t *src1_8, uint32_t src1_stride,
                                  const uint8_t *mask, int w, int h, int bd) {
  int i, j;
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst_8);
  const uint16_t *src0 = CONVERT_TO_SHORTPTR(src0_8);
  const uint16_t *src1 = CONVERT_TO_SHORTPTR(src1_8);
  (void)bd;

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  assert(bd == 8 || bd == 10 || bd == 12);

  for (i = 0; i < h; ++i) {
    const int m = mask[i];
    for (j = 0; j < w; ++j) {
      dst[i * dst_stride + j] = AOM_BLEND_A64(m, src0[i * src0_stride + j],
                                              src1[i * src1_stride + j]);
    }
  }
}